

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP5Serializer::MarshalAttribute
          (BP5Serializer *this,char *Name,DataType Type,size_t ElemSize,size_t ElemCount,void *Data)

{
  FMFieldList *FieldP;
  int *CountP;
  int iVar1;
  char *__s;
  size_t sVar2;
  BP5Serializer *__dest;
  char *pcVar3;
  BP5Serializer *pBVar4;
  char **__src;
  int iVar5;
  char *AttrString;
  
  AttrString = (char *)0x0;
  this->NewAttribute = true;
  __src = (char **)Data;
  if (Type == String) {
    __src = &AttrString;
    ElemSize = 8;
    AttrString = (char *)Data;
  }
  iVar5 = (int)ElemSize;
  if (ElemCount == 0xffffffffffffffff) {
    pBVar4 = this;
    pcVar3 = BuildVarName(this,Name,GlobalValue,Type,iVar5);
    AddField(pBVar4,&(this->Info).AttributeFields,&(this->Info).AttributeFieldCount,pcVar3,Type,
             iVar5);
    free(pcVar3);
    RecalcAttributeStorageSize(this);
    memcpy((void *)((long)(this->Info).AttributeFields[(long)(this->Info).AttributeFieldCount + -1].
                          field_offset + (long)(this->Info).AttributeData),__src,ElemSize);
  }
  else {
    __s = BuildVarName(this,Name,GlobalArray,0,0);
    sVar2 = strlen(__s);
    __dest = (BP5Serializer *)malloc(sVar2 + 0xb);
    strcpy((char *)__dest,__s);
    sVar2 = strlen((char *)__dest);
    pcVar3 = (char *)((long)&__dest->_vptr_BP5Serializer + sVar2);
    pcVar3[0] = '_';
    pcVar3[1] = '\0';
    pBVar4 = __dest;
    sVar2 = strlen((char *)__dest);
    builtin_strncpy((char *)((long)&__dest->_vptr_BP5Serializer + sVar2),"ElemCoun",8);
    *(undefined2 *)((long)&__dest->m_Engine + sVar2) = 0x74;
    FieldP = &(this->Info).AttributeFields;
    CountP = &(this->Info).AttributeFieldCount;
    AddField(pBVar4,FieldP,CountP,(char *)__dest,Int64,8);
    iVar1 = (this->Info).AttributeFields[(long)(this->Info).AttributeFieldCount + -1].field_offset;
    AddVarArrayField(pBVar4,FieldP,CountP,__s,Type,iVar5,(char *)__dest);
    iVar5 = (this->Info).AttributeFields[(long)(this->Info).AttributeFieldCount + -1].field_offset;
    free(__dest);
    free(__s);
    RecalcAttributeStorageSize(this);
    *(size_t *)((long)(this->Info).AttributeData + (long)iVar1) = ElemCount;
    *(void **)((long)(this->Info).AttributeData + (long)iVar5) = Data;
  }
  return;
}

Assistant:

void BP5Serializer::MarshalAttribute(const char *Name, const DataType Type, size_t ElemSize,
                                     size_t ElemCount, const void *Data)
{

    const char *AttrString = NULL;
    const void *DataAddress = Data;

    NewAttribute = true;
    if (Type == DataType::String)
    {
        ElemSize = sizeof(char *);
        AttrString = (char *)Data;
        DataAddress = (const char *)&AttrString;
    }
    if (ElemCount == (size_t)(-1))
    {
        // simple field, only simple attribute name and value
        char *SstName = BuildVarName(Name, ShapeID::GlobalValue, (int)Type, (int)ElemSize);
        AddField(&Info.AttributeFields, &Info.AttributeFieldCount, SstName, Type, (int)ElemSize);
        free(SstName);
        RecalcAttributeStorageSize();
        int DataOffset = Info.AttributeFields[Info.AttributeFieldCount - 1].field_offset;
        memcpy((char *)(Info.AttributeData) + DataOffset, DataAddress, ElemSize);
    }
    else
    {
        // Array field.  To attribute data add dimension field and dynamic array
        // field
        char *ArrayName = BuildVarName(Name, ShapeID::GlobalArray, 0,
                                       0); // size and type in full field spec
        char *ElemCountName = ConcatName(ArrayName, "ElemCount");
        AddField(&Info.AttributeFields, &Info.AttributeFieldCount, ElemCountName, DataType::Int64,
                 sizeof(int64_t));
        int CountOffset = Info.AttributeFields[Info.AttributeFieldCount - 1].field_offset;
        AddVarArrayField(&Info.AttributeFields, &Info.AttributeFieldCount, ArrayName, Type,
                         (int)ElemSize, ElemCountName);
        int DataOffset = Info.AttributeFields[Info.AttributeFieldCount - 1].field_offset;
        free(ElemCountName);
        free(ArrayName);

        RecalcAttributeStorageSize();

        memcpy((char *)(Info.AttributeData) + CountOffset, &ElemCount, sizeof(size_t));
        memcpy((char *)(Info.AttributeData) + DataOffset, &Data, sizeof(void *));
    }
}